

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::Read
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZStream *buf,void *context)

{
  size_t *psVar1;
  long *plVar2;
  int iVar3;
  long **pplVar4;
  _Node *p_Var5;
  ostream *poVar6;
  size_t sVar7;
  int iVar8;
  int classid;
  int sz;
  TPZOneShapeRestraint one;
  int local_250;
  int local_24c;
  _func_int **local_248;
  TPZVec<int> local_240;
  int local_220 [4];
  TPZManVector<int,_5> local_210;
  long *local_1d8;
  long local_1c8 [2];
  undefined1 local_1b8 [24];
  int64_t local_1a0;
  pair<long,_int> local_198 [4];
  undefined **local_158;
  ios_base *local_150;
  int64_t local_140;
  ios_base local_138 [264];
  
  TPZInterpolatedElement::Read((TPZInterpolatedElement *)this,buf,context);
  pplVar4 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[0x1f])(buf,*pplVar4,0x15);
  TPZVec<int>::TPZVec(&local_240,0);
  local_240._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_240.fStore = local_220;
  local_240.fNElements = 0;
  local_240.fNAlloc = 0;
  TPZStream::Read<int>(buf,&local_240,(void *)0x0);
  TPZIntPrism3D::SetOrder(&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).fIntRule,&local_240,0);
  TPZVec<int>::TPZVec(&local_210.super_TPZVec<int>,0);
  local_210.super_TPZVec<int>.fStore = local_210.fExtAlloc;
  local_210.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_210.super_TPZVec<int>.fNElements = 0;
  local_210.super_TPZVec<int>.fNAlloc = 0;
  TPZStream::Read<int>(buf,&local_210.super_TPZVec<int>,(void *)0x0);
  TPZManVector<int,_5>::operator=(&this->fSideOrient,&local_210);
  pplVar4 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[0x1f])(buf,*pplVar4,0x15);
  (*buf->_vptr_TPZStream[0x1d])
            (buf,&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
                  super_TPZInterpolationSpace.fPreferredOrder,1);
  TPZStream::Read<int>(buf,&(this->fSideOrient).super_TPZVec<int>,(void *)0x0);
  (*buf->_vptr_TPZStream[0x1d])(buf,&local_24c,1);
  if (0 < local_24c) {
    local_248 = (_func_int **)&PTR__TPZVec_018f8488;
    iVar8 = 0;
    do {
      TPZOneShapeRestraint::TPZOneShapeRestraint((TPZOneShapeRestraint *)local_1b8);
      TPZOneShapeRestraint::Read((TPZOneShapeRestraint *)local_1b8,buf);
      p_Var5 = std::__cxx11::list<TPZOneShapeRestraint,std::allocator<TPZOneShapeRestraint>>::
               _M_create_node<TPZOneShapeRestraint_const&>
                         ((list<TPZOneShapeRestraint,std::allocator<TPZOneShapeRestraint>> *)
                          &this->fRestraints,(TPZOneShapeRestraint *)local_1b8);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      psVar1 = &(this->fRestraints).
                super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_150 == local_138) {
        local_150 = (ios_base *)0x0;
        local_140 = 0;
        local_158 = &PTR__TPZVec_01813ef0;
      }
      else {
        local_140 = 0;
        local_158 = &PTR__TPZVec_01813ef0;
        if (local_150 != (ios_base *)0x0) {
          operator_delete__(local_150);
        }
      }
      if ((pair<long,_int> *)local_1b8._8_8_ != local_198) {
        local_1a0 = 0;
        local_1b8._0_8_ = local_248;
        if ((pair<long,_int> *)local_1b8._8_8_ != (pair<long,_int> *)0x0) {
          operator_delete__((void *)local_1b8._8_8_);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_24c);
  }
  local_250 = -1;
  (*buf->_vptr_TPZStream[0x1d])(buf,&local_250,1);
  iVar8 = local_250;
  iVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x20))(this);
  if (iVar8 != iVar3) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar6 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"ERROR - ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "virtual void TPZCompElHDiv<pzshape::TPZShapePrism>::Read(TPZStream &, void *) [TSHAPE = pzshape::TPZShapePrism]"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," trying to restore an object id ",0x20);
    iVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x20))(this);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," and classid read = ",0x14);
    std::ostream::operator<<(poVar6,local_250);
    std::__cxx11::stringbuf::str();
    plVar2 = local_1d8;
    if (local_1d8 == (long *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
    }
    else {
      sVar7 = strlen((char *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar2,sVar7)
      ;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_210.super_TPZVec<int>.fStore != local_210.fExtAlloc) {
    local_210.super_TPZVec<int>.fNAlloc = 0;
    local_210.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_210.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_210.super_TPZVec<int>.fStore);
    }
  }
  if (local_240.fStore != local_220) {
    local_240.fNAlloc = 0;
    local_240._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_240.fStore != (int *)0x0) {
      operator_delete__(local_240.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Read(TPZStream &buf, void *context)
{
	TPZInterpolatedElement::Read(buf,context);
  buf.Read(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order;
	buf.Read(order);
	this-> fIntRule.SetOrder(order);
    TPZManVector<int, TSHAPE::NFacets> SideOrient;
    buf.Read(SideOrient);
    fSideOrient = SideOrient;
	buf.Read(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Read(&this->fPreferredOrder,1);
    buf.Read(fSideOrient);
    int sz;
    buf.Read(&sz);
    for (int i=0; i<sz; i++) {
        TPZOneShapeRestraint one;
        one.Read(buf);
        fRestraints.push_back(one);
    }
	int classid = -1;
	buf.Read( &classid, 1 );
	if ( classid != this->ClassId())
	{
		std::stringstream sout;
		sout << "ERROR - " << __PRETTY_FUNCTION__
        << " trying to restore an object id " << this->ClassId() << " and classid read = " << classid;
		LOGPZ_ERROR ( logger, sout.str().c_str() );
	}
}